

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::InputFile::Data::fillBuffer
          (Data *this,ConstIterator to,int scanline1,int scanline2,int yStart,int xStart,int width)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ArgExc *this_00;
  float *pfVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  float f;
  half fill;
  
  if ((*(int *)((long)to._i._M_node + 0x140) == 1) && (*(int *)((long)to._i._M_node + 0x144) == 1))
  {
    iVar3 = *(int *)((long)to._i._M_node + 0x120);
    lVar4 = *(long *)((long)to._i._M_node + 0x130);
    lVar5 = *(long *)((long)to._i._M_node + 0x138);
    bVar2 = *(byte *)((long)to._i._M_node + 0x151);
    dVar1 = *(double *)((long)to._i._M_node + 0x148);
    lVar11 = 0;
    if ((*(byte *)((long)to._i._M_node + 0x150) & 1) == 0) {
      lVar11 = xStart * lVar4;
    }
    lVar6 = *(long *)((long)to._i._M_node + 0x128);
    f = (float)dVar1;
    iVar7 = 0;
    if (0 < width) {
      iVar7 = width;
    }
    for (lVar12 = (long)scanline1; lVar12 <= scanline2; lVar12 = lVar12 + 1) {
      lVar8 = lVar12;
      if ((bVar2 & 1) != 0) {
        lVar8 = lVar12 - yStart;
      }
      pfVar10 = (float *)(lVar8 * lVar5 + lVar11 + lVar6);
      iVar9 = iVar7 - iVar3;
      if (iVar3 == 0) {
        while (iVar9 != 0) {
          *pfVar10 = (float)(long)dVar1;
          pfVar10 = (float *)((long)pfVar10 + lVar4);
          iVar9 = iVar9 + -1;
        }
      }
      else if (iVar3 == 1) {
        Imath_3_2::half::half(&fill,f);
        iVar9 = iVar7;
        while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
          *(uint16_t *)pfVar10 = fill._h;
          pfVar10 = (float *)((long)pfVar10 + lVar4);
        }
      }
      else {
        iVar9 = iVar7;
        if (iVar3 == 2) {
          while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
            *pfVar10 = f;
            pfVar10 = (float *)((long)pfVar10 + lVar4);
          }
        }
      }
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::Data::fillBuffer (FrameBuffer::ConstIterator to,
                             int scanline1, int scanline2,
                             int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        //
        // Copy all pixels for the scanline in this row of tiles
        //

        switch (toSlice.type)
        {
            case UINT:
            {
                unsigned int fill =
                    static_cast<unsigned int> (toSlice.fillValue);
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<unsigned int*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case HALF:
            {
                half fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<half*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case FLOAT:
            {
                float fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<float*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case NUM_PIXELTYPES:
                break;
        }
    }
}